

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

ProString * __thiscall QMakeEvaluator::propertyValue(QMakeEvaluator *this,ProKey *name)

{
  long lVar1;
  bool bVar2;
  QListSpecialMethods<QString> *in_RDX;
  ProString *in_RSI;
  QMakeGlobals *in_RDI;
  long in_FS_OFFSET;
  ProString *ret;
  QString *in_stack_ffffffffffffff88;
  QMakeGlobals *this_00;
  QLatin1String in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QLatin1String::QLatin1String((QLatin1String *)in_RSI,&in_RDI->do_cache);
  bVar2 = ProString::operator==(in_RSI,in_stack_ffffffffffffffd0);
  if (bVar2) {
    QListSpecialMethods<QString>::join(in_RDX,&in_RSI->m_string);
    ProString::ProString((ProString *)in_RDI,in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x2f1c4e);
  }
  else {
    memset(in_RDI,0xaa,0x30);
    QMakeGlobals::propertyValue(this_00,(ProKey *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (ProString *)this_00;
}

Assistant:

ProString QMakeEvaluator::propertyValue(const ProKey &name) const
{
    if (name == QLatin1String("QMAKE_MKSPECS"))
        return ProString(m_mkspecPaths.join(m_option->dirlist_sep));
    ProString ret = m_option->propertyValue(name);
//    if (ret.isNull())
//        evalError(fL1S("Querying unknown property %1").arg(name.toQStringView()));
    return ret;
}